

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

int baryonyx::numeric_cast<int,int>(int s)

{
  bool bVar1;
  numeric_cast_failure *this;
  int s_local;
  
  bVar1 = is_numeric_castable<int,int>(s);
  if (!bVar1) {
    this = (numeric_cast_failure *)__cxa_allocate_exception(0x10);
    numeric_cast_failure::numeric_cast_failure(this);
    __cxa_throw(this,&numeric_cast_failure::typeinfo,numeric_cast_failure::~numeric_cast_failure);
  }
  return s;
}

Assistant:

inline Target
numeric_cast(Source s)
{
    if (!is_numeric_castable<Target>(s))
        throw numeric_cast_failure();

    return static_cast<Target>(s);
}